

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositedBupOutputter.cpp
# Opt level: O1

ssize_t __thiscall
CompositedBupOutputter::write(CompositedBupOutputter *this,int __fd,void *__buf,size_t __n)

{
  size_type sVar1;
  pointer pcVar2;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t sVar3;
  path *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  path local_b8;
  path local_90;
  path local_68;
  path local_40;
  
  sVar1 = (this->withMouthName)._M_string_length;
  if (sVar1 == 0) {
    sVar1 = (this->withFaceName)._M_string_length;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    if (sVar1 == 0) {
      pcVar2 = (this->baseName)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,pcVar2,pcVar2 + (this->baseName)._M_string_length);
      std::__cxx11::string::append((char *)&local_d8);
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_b8,&local_d8,auto_format);
      std::filesystem::__cxx11::operator/(&local_90,&this->basePath,&local_b8);
      (*(this->super_BupOutputter)._vptr_BupOutputter[6])(this,&this->base,&local_90);
      this_00 = &local_90;
    }
    else {
      pcVar2 = (this->withFaceName)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>((string *)&local_d8,pcVar2,pcVar2 + sVar1);
      std::__cxx11::string::append((char *)&local_d8);
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_b8,&local_d8,auto_format);
      std::filesystem::__cxx11::operator/(&local_68,&this->basePath,&local_b8);
      (*(this->super_BupOutputter)._vptr_BupOutputter[6])(this,&this->withFace,&local_68);
      this_00 = &local_68;
    }
  }
  else {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    pcVar2 = (this->withMouthName)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&local_d8,pcVar2,pcVar2 + sVar1);
    std::__cxx11::string::append((char *)&local_d8);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_b8,&local_d8,auto_format);
    std::filesystem::__cxx11::operator/(&local_40,&this->basePath,&local_b8);
    (*(this->super_BupOutputter)._vptr_BupOutputter[6])(this,&this->withMouth,&local_40);
    this_00 = &local_40;
  }
  std::filesystem::__cxx11::path::~path(this_00);
  std::filesystem::__cxx11::path::~path(&local_b8);
  sVar3 = extraout_RAX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    sVar3 = extraout_RAX_00;
  }
  return sVar3;
}

Assistant:

void write() override {
		if (!withMouthName.empty()) {
			write(withMouth, basePath/fs::u8path(withMouthName + ".png"));
		}
		else if (!withFaceName.empty()) {
			write(withFace, basePath/fs::u8path(withFaceName + ".png"));
		}
		else {
			write(base, basePath/fs::u8path(baseName + ".png"));
		}
	}